

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void duckdb::ListUpdateFunction
               (Vector *inputs,AggregateInputData *aggr_input_data,idx_t input_count,
               Vector *state_vector,idx_t count)

{
  RecursiveUnifiedVectorFormat *pRVar1;
  RecursiveUnifiedVectorFormat *pRVar2;
  ListBindData *pLVar3;
  idx_t iVar4;
  ulong in_RCX;
  long in_RSI;
  Vector *in_RDI;
  UnifiedVectorFormat *in_R8;
  ListAggState *state;
  idx_t i;
  ListBindData *list_bind_data;
  ListAggState **states;
  UnifiedVectorFormat states_data;
  RecursiveUnifiedVectorFormat input_data;
  Vector *input;
  RecursiveUnifiedVectorFormat *in_stack_fffffffffffffeb0;
  RecursiveUnifiedVectorFormat *in_stack_fffffffffffffec0;
  UnifiedVectorFormat *local_118;
  SelectionVector *local_100 [11];
  RecursiveUnifiedVectorFormat local_a8;
  Vector *local_30;
  UnifiedVectorFormat *local_28;
  ulong local_20;
  long local_10;
  
  local_30 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  RecursiveUnifiedVectorFormat::RecursiveUnifiedVectorFormat(in_stack_fffffffffffffec0);
  duckdb::Vector::RecursiveToUnifiedFormat(local_30,(ulong)local_28,&local_a8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_100);
  duckdb::Vector::ToUnifiedFormat(local_20,local_28);
  pRVar2 = (RecursiveUnifiedVectorFormat *)
           UnifiedVectorFormat::GetData<duckdb::ListAggState*>((UnifiedVectorFormat *)local_100);
  optional_ptr<duckdb::FunctionData,_true>::operator->
            ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_fffffffffffffeb0);
  pLVar3 = FunctionData::Cast<duckdb::ListBindData>((FunctionData *)in_stack_fffffffffffffeb0);
  for (local_118 = (UnifiedVectorFormat *)0x0; local_118 < local_28; local_118 = local_118 + 1) {
    in_stack_fffffffffffffeb0 = pRVar2;
    iVar4 = SelectionVector::get_index(local_100[0],(idx_t)local_118);
    pRVar1 = *(RecursiveUnifiedVectorFormat **)(&in_stack_fffffffffffffeb0->unified + iVar4 * 8);
    duckdb::ArenaAllocator::AlignNext();
    duckdb::ListSegmentFunctions::AppendRow
              ((ArenaAllocator *)&pLVar3->functions,*(LinkedList **)(local_10 + 8),pRVar1,
               (ulong *)&local_a8);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&in_stack_fffffffffffffeb0->unified);
  RecursiveUnifiedVectorFormat::~RecursiveUnifiedVectorFormat(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

static void ListUpdateFunction(Vector inputs[], AggregateInputData &aggr_input_data, idx_t input_count,
                               Vector &state_vector, idx_t count) {

	D_ASSERT(input_count == 1);
	auto &input = inputs[0];
	RecursiveUnifiedVectorFormat input_data;
	Vector::RecursiveToUnifiedFormat(input, count, input_data);

	UnifiedVectorFormat states_data;
	state_vector.ToUnifiedFormat(count, states_data);
	auto states = UnifiedVectorFormat::GetData<ListAggState *>(states_data);

	auto &list_bind_data = aggr_input_data.bind_data->Cast<ListBindData>();

	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[states_data.sel->get_index(i)];
		aggr_input_data.allocator.AlignNext();
		list_bind_data.functions.AppendRow(aggr_input_data.allocator, state.linked_list, input_data, i);
	}
}